

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O0

void nsvg__imageBounds(NSVGparser *p,float *bounds)

{
  NSVGshape *pNVar1;
  float fVar2;
  NSVGshape *local_20;
  NSVGshape *shape;
  float *bounds_local;
  NSVGparser *p_local;
  
  pNVar1 = p->image->shapes;
  if (pNVar1 == (NSVGshape *)0x0) {
    bounds[3] = 0.0;
    bounds[2] = 0.0;
    bounds[1] = 0.0;
    *bounds = 0.0;
  }
  else {
    *bounds = pNVar1->bounds[0];
    bounds[1] = pNVar1->bounds[1];
    bounds[2] = pNVar1->bounds[2];
    bounds[3] = pNVar1->bounds[3];
    for (local_20 = pNVar1->next; local_20 != (NSVGshape *)0x0; local_20 = local_20->next) {
      fVar2 = nsvg__minf(*bounds,local_20->bounds[0]);
      *bounds = fVar2;
      fVar2 = nsvg__minf(bounds[1],local_20->bounds[1]);
      bounds[1] = fVar2;
      fVar2 = nsvg__maxf(bounds[2],local_20->bounds[2]);
      bounds[2] = fVar2;
      fVar2 = nsvg__maxf(bounds[3],local_20->bounds[3]);
      bounds[3] = fVar2;
    }
  }
  return;
}

Assistant:

static void nsvg__imageBounds(NSVGparser* p, float* bounds)
{
	NSVGshape* shape;
	shape = p->image->shapes;
	if (shape == NULL) {
		bounds[0] = bounds[1] = bounds[2] = bounds[3] = 0.0;
		return;
	}
	bounds[0] = shape->bounds[0];
	bounds[1] = shape->bounds[1];
	bounds[2] = shape->bounds[2];
	bounds[3] = shape->bounds[3];
	for (shape = shape->next; shape != NULL; shape = shape->next) {
		bounds[0] = nsvg__minf(bounds[0], shape->bounds[0]);
		bounds[1] = nsvg__minf(bounds[1], shape->bounds[1]);
		bounds[2] = nsvg__maxf(bounds[2], shape->bounds[2]);
		bounds[3] = nsvg__maxf(bounds[3], shape->bounds[3]);
	}
}